

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O2

string_view __thiscall cinatra::coro_http_request::get_boundary(coro_http_request *this)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  char *pcVar3;
  string_view key;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view sVar5;
  string_view content_type;
  
  key._M_str = "content-type";
  key._M_len = 0xc;
  content_type = get_header_value(this,key);
  if (content_type._M_len == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                      (&content_type,"=",0xffffffffffffffff);
    if (sVar2 != 0xffffffffffffffff) {
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&content_type,sVar2 + 1,0xffffffffffffffff);
      sVar5._M_len = bVar4._M_len;
      sVar5._M_str = bVar4._M_str;
      return sVar5;
    }
    pcVar3 = "";
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = pcVar3;
  return (string_view)(auVar1 << 0x40);
}

Assistant:

std::string_view get_boundary() {
    auto content_type = get_header_value("content-type");
    if (content_type.empty()) {
      return {};
    }

    auto pos = content_type.rfind("=");
    if (pos == std::string_view::npos) {
      return "";
    }

    return content_type.substr(pos + 1);
  }